

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cowsay.cpp
# Opt level: O2

void __thiscall Cow_message_integrity::test_method(Cow_message_integrity *this)

{
  StubbingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rootWithoutConst;
  MockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar1;
  MockingContext<unsigned_long> *pMVar2;
  long lVar3;
  allocator local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  Cow cow;
  shared_ptr<IMessageHolder> message;
  MethodProgress<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  progress;
  string said;
  __shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2> local_1f0;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  Mock<IMessageHolder> mockHolder;
  
  fakeit::Mock<IMessageHolder>::Mock(&mockHolder);
  fakeit::MockImpl<IMessageHolder>::stubMethod<1,std::__cxx11::string,IMessageHolder,,void>
            ((MockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&said,&mockHolder.impl,1);
  std::__cxx11::string::string((string *)&local_180,"mockHolder",(allocator *)&message);
  std::__cxx11::string::string((string *)&local_1a0,"GetMessage",(allocator *)&cow);
  pMVar1 = fakeit::
           MockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::setMethodDetails((MockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&said,&local_180,&local_1a0);
  fakeit::WhenFunctor::
  MethodProgress<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  MethodProgress(&progress,
                 (StubbingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((pMVar1->
                     super_MethodMockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ).super_Sequence._vptr_Sequence[-3] +
                    (long)&(pMVar1->
                           super_MethodMockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).super_Sequence._vptr_Sequence));
  std::__cxx11::string::string((string *)&local_280,"moo",&local_281);
  fakeit::MethodStubbingProgress<std::__cxx11::string>::AlwaysReturn<std::__cxx11::string>
            ((MethodStubbingProgress<std::__cxx11::string> *)&progress,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  fakeit::WhenFunctor::
  MethodProgress<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MethodProgress(&progress);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  fakeit::
  MockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MockingContext((MockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&said);
  fakeit::MockImpl<IMessageHolder>::stubMethod<2,unsigned_long,IMessageHolder,,void>
            ((MockingContext<unsigned_long> *)&said,&mockHolder.impl,9);
  std::__cxx11::string::string((string *)&local_1c0,"mockHolder",(allocator *)&message);
  std::__cxx11::string::string((string *)&local_1e0,"GetLength",(allocator *)&cow);
  pMVar2 = fakeit::MockingContext<unsigned_long>::setMethodDetails
                     ((MockingContext<unsigned_long> *)&said,&local_1c0,&local_1e0);
  fakeit::WhenFunctor::MethodProgress<unsigned_long>::MethodProgress
            ((MethodProgress<unsigned_long> *)&progress,
             (StubbingContext<unsigned_long> *)
             ((pMVar2->super_MethodMockingContext<unsigned_long>).super_Sequence._vptr_Sequence[-3]
             + (long)&(pMVar2->super_MethodMockingContext<unsigned_long>).super_Sequence.
                      _vptr_Sequence));
  local_280._M_dataplus._M_p = (pointer)0x3;
  fakeit::MethodStubbingProgress<unsigned_long>::AlwaysReturn<unsigned_long>
            ((MethodStubbingProgress<unsigned_long> *)&progress,(unsigned_long *)&local_280);
  fakeit::WhenFunctor::MethodProgress<unsigned_long>::~MethodProgress
            ((MethodProgress<unsigned_long> *)&progress);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  fakeit::MockingContext<unsigned_long>::~MockingContext((MockingContext<unsigned_long> *)&said);
  TestHelper::PointToMocked<IMessageHolder>((TestHelper *)&message,mockHolder.impl._proxy.instance);
  cow = (Cow)&PTR_Say_abi_cxx11__0012dd60;
  std::__shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1f0,&message.super___shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>);
  Cow::Say_abi_cxx11_(&said,&cow,(shared_ptr<IMessageHolder> *)&local_1f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0._M_refcount);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/test/cowsay.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x28);
  lVar3 = std::__cxx11::string::find((char *)&said,0x11910e);
  local_280._M_string_length = 0;
  local_280.field_2._M_allocated_capacity = 0;
  progress._progress.pData._0_1_ = 0;
  progress.
  super_MethodStubbingProgress<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MethodStubbingProgress = (_func_int **)&PTR__lazy_ostream_0012dbb0;
  progress._progress.reference = (RefCount *)&boost::unit_test::lazy_ostream::inst;
  progress._context =
       (StubbingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)anon_var_dwarf_1d882;
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/test/cowsay.cpp"
  ;
  local_f8 = "";
  local_280._M_dataplus._M_p._0_1_ = lVar3 != -1;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_280.field_2._M_allocated_capacity);
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/test/cowsay.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x29);
  lVar3 = std::__cxx11::string::find((char *)&said,0x119112);
  local_280._M_dataplus._M_p._0_1_ = lVar3 != -1;
  local_280._M_string_length = 0;
  local_280.field_2._M_allocated_capacity = 0;
  progress._progress.pData._0_1_ = 0;
  progress.
  super_MethodStubbingProgress<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MethodStubbingProgress = (_func_int **)&PTR__lazy_ostream_0012dbf0;
  progress._progress.reference = (RefCount *)&boost::unit_test::lazy_ostream::inst;
  progress._context =
       (StubbingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)anon_var_dwarf_1d8a6;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/test/cowsay.cpp"
  ;
  local_128 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_280.field_2._M_allocated_capacity);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/test/cowsay.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x2a);
  lVar3 = std::__cxx11::string::find((char *)&said,0x11af2f);
  local_280._M_dataplus._M_p._0_1_ = lVar3 != -1;
  local_280._M_string_length = 0;
  local_280.field_2._M_allocated_capacity = 0;
  progress._progress.pData._0_1_ = 0;
  progress.
  super_MethodStubbingProgress<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MethodStubbingProgress = (_func_int **)&PTR__lazy_ostream_0012dbf0;
  progress._progress.reference = (RefCount *)&boost::unit_test::lazy_ostream::inst;
  progress._context =
       (StubbingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)anon_var_dwarf_1d8ca;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/test/cowsay.cpp"
  ;
  local_158 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_280.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&said);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&message.super___shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  fakeit::Mock<IMessageHolder>::~Mock(&mockHolder);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Cow_message_integrity)
{
    // mock any dependencies that aren't internal to this library
    Mock<IMessageHolder> mockHolder;
    When(Method(mockHolder, GetMessage)).AlwaysReturn("moo");
    When(Method(mockHolder, GetLength)).AlwaysReturn(3);

    auto message = TestHelper::PointToMocked<IMessageHolder>(&mockHolder.get());

    Cow cow;
    auto said = cow.Say(message);

/*
  v---- checking for this

(moo)

    \   ^__^          v----- and this
     \  (oo)\_______
        (__)\       )\/\
            ||----w |
            ||     ||

                  ^--- and this
*/

    BOOST_CHECK_MESSAGE(said.find("moo") != string::npos, "If the message was moo then the cow should have said moo");
    BOOST_CHECK_MESSAGE(said.find("w") != string::npos, "The cow should have had utters");
    BOOST_CHECK_MESSAGE(said.find("\\/\\") != string::npos, "The cow should have had a tail");
}